

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

void PresentScreen(void)

{
  SDL12_Rect SVar1;
  QueuedOverlayItem *pQVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  SDL_Renderer *pSVar5;
  QueuedOverlayItem *pQVar6;
  undefined1 auVar7 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  SDL_Rect local_38;
  
  (*SDL20_LockMutex)(VideoRendererLock);
  pSVar5 = VideoRenderer20;
  if (VideoRenderer20 != (SDL_Renderer *)0x0) {
    if (EventThreadEnabled != SDL_FALSE) {
      SDL_PumpEvents();
    }
    (*SDL20_RenderClear)(pSVar5);
    (*SDL20_RenderCopy)(pSVar5,VideoTexture20,(SDL_Rect *)0x0,(SDL_Rect *)0x0);
    pQVar6 = QueuedDisplayOverlays.next;
    if (QueuedDisplayOverlays.next != (QueuedOverlayItem *)0x0) {
      while (pQVar6 != (QueuedOverlayItem *)0x0) {
        pQVar2 = pQVar6->next;
        if (pQVar6->overlay12 != (SDL12_Overlay *)0x0) {
          SVar1 = pQVar6->dstrect12;
          auVar7._8_8_ = 0;
          auVar7._0_2_ = SVar1.x;
          auVar7._2_2_ = SVar1.y;
          auVar7._4_2_ = SVar1.w;
          auVar7._6_2_ = SVar1.h;
          auVar7 = pshuflw(in_XMM1,auVar7,0x60);
          local_38.x = auVar7._0_4_ >> 0x10;
          local_38.y = auVar7._4_4_ >> 0x10;
          auVar3._8_4_ = 0;
          auVar3._0_2_ = SVar1.x;
          auVar3._2_2_ = SVar1.y;
          auVar3._4_2_ = SVar1.w;
          auVar3._6_2_ = SVar1.h;
          auVar3._12_2_ = SVar1.h;
          auVar4._8_2_ = SVar1.w;
          auVar4._0_2_ = SVar1.x;
          auVar4._2_2_ = SVar1.y;
          auVar4._4_2_ = SVar1.w;
          auVar4._6_2_ = SVar1.h;
          auVar4._10_4_ = auVar3._10_4_;
          local_38._8_8_ = ZEXT68(auVar4._8_6_);
          (*SDL20_RenderCopy)(pSVar5,*pQVar6->overlay12->hwdata,(SDL_Rect *)0x0,&local_38);
        }
        (*SDL20_free)(pQVar6);
        in_XMM1._8_8_ = extraout_XMM1_Qb;
        in_XMM1._0_8_ = extraout_XMM1_Qa;
        pQVar6 = pQVar2;
      }
      QueuedDisplayOverlays.next = (QueuedOverlayItem *)0x0;
      QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;
    }
    (*SDL20_RenderPresent)(pSVar5);
    VideoSurfaceUpdatedInBackgroundThread = 0;
    VideoSurfaceLastPresentTicks = (*SDL20_GetTicks)();
    VideoSurfacePresentTicks = 0;
    UnlockVideoRenderer();
  }
  return;
}

Assistant:

static void
PresentScreen(void)
{
    QueuedOverlayItem *overlay;
    SDL_Renderer *renderer = LockVideoRenderer();

    if (!renderer) {
        return;
    }

    /* We don't actually implement an event thread in sdl12-compat, but some
     * games will only call SDL_PeepEvents(), which doesn't otherwise pump
     * events, and get stuck when they've consumed all the events.
     *
     * Just pumping the event loop here simulates an event thread well enough
     * for most things.
     */
    if (EventThreadEnabled) {
        SDL_PumpEvents();
    }

    SDL20_RenderClear(renderer);
    SDL20_RenderCopy(renderer, VideoTexture20, NULL, NULL);

    /* Render any pending YUV overlay over the surface texture. */
    overlay = QueuedDisplayOverlays.next;
    if (overlay) {
        while (overlay != NULL) {
            QueuedOverlayItem *next = overlay->next;
            if (overlay->overlay12) {
                SDL12_YUVData *hwdata = (SDL12_YUVData *) overlay->overlay12->hwdata;
                SDL_Rect dstrect20;
                SDL20_RenderCopy(renderer, hwdata->texture20, NULL, Rect12to20(&overlay->dstrect12, &dstrect20));
            }
            SDL_free(overlay);
            overlay = next;
        }
        QueuedDisplayOverlays.next = NULL;
        QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;
    }

    SDL20_RenderPresent(renderer);
    VideoSurfaceUpdatedInBackgroundThread = SDL_FALSE;
    VideoSurfaceLastPresentTicks = SDL20_GetTicks();
    VideoSurfacePresentTicks = 0;

    UnlockVideoRenderer();
}